

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f998::logical_combination_error_handler::propagate
          (logical_combination_error_handler *this,error_handler *e,string *prefix)

{
  pointer peVar1;
  pointer peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar1 = (this->error_entry_list_).
           super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (peVar2 = (this->error_entry_list_).
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar2 != peVar1; peVar2 = peVar2 + 1) {
    std::operator+(&local_50,prefix,&peVar2->message_);
    (*e->_vptr_error_handler[2])(e,peVar2,&peVar2->instance_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void propagate(error_handler &e, const std::string &prefix) const
	{
		for (const error_entry &entry : error_entry_list_)
			e.error(entry.ptr_, entry.instance_, prefix + entry.message_);
	}